

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O0

bool genVulkanFunctionsPH
               (QList<VkSpecParser::Command> *commands,
               QMap<QString,_QList<QString>_> *versionCommandMapping,QString *licHeaderFn,
               QString *outputBase)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  QMessageLogger *in_RCX;
  Preamble *in_RDI;
  long in_FS_OFFSET;
  Command *c;
  QList<VkSpecParser::Command> *__range2;
  QStringList *coreFunctionsInVersion;
  QString *version;
  QStringList *__range1;
  int instLevelCount;
  int devLevelCount;
  char16_t *str;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator __end1;
  const_iterator __begin1;
  QFile f;
  undefined4 in_stack_fffffffffffffe08;
  CaseSensitivity in_stack_fffffffffffffe0c;
  enum_type in_stack_fffffffffffffe10;
  enum_type in_stack_fffffffffffffe14;
  QListSpecialMethods<QString> *in_stack_fffffffffffffe18;
  Command *in_stack_fffffffffffffe28;
  Preamble *in_stack_fffffffffffffe30;
  uint local_1b0;
  uint local_1ac;
  bool local_179;
  char local_148 [48];
  Command *local_118;
  const_iterator local_110;
  const_iterator local_108 [4];
  QString *local_e8;
  const_iterator local_e0;
  const_iterator local_d8;
  QString local_d0 [2];
  char local_a0 [32];
  QArrayDataPointer<char16_t> local_80 [3];
  undefined1 local_30 [24];
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_80,(Data *)0x0,L"_p.h",4);
  QString::QString((QString *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  operator+((QString *)in_stack_fffffffffffffe18,
            (QString *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<const_QString_&,_QString> *)
             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  QFile::QFile((QFile *)&local_18,(QString *)local_30);
  QString::~QString((QString *)0x10669b);
  QStringBuilder<const_QString_&,_QString>::~QStringBuilder
            ((QStringBuilder<const_QString_&,_QString> *)0x1066a8);
  QString::~QString((QString *)0x1066b5);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  operator|(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10);
  uVar2 = QFile::open((QFlags *)&local_18);
  if ((uVar2 & 1) == 0) {
    QMessageLogger::QMessageLogger
              (in_RCX,(char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
               (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    QFile::fileName();
    QtPrivate::asString(local_d0);
    QString::toLocal8Bit((QString *)in_stack_fffffffffffffe28);
    pcVar3 = QByteArray::constData((QByteArray *)0x106743);
    QMessageLogger::warning(local_a0,"Failed to write %s",pcVar3);
    QByteArray::~QByteArray((QByteArray *)0x106769);
    QString::~QString((QString *)0x106776);
    local_179 = false;
  }
  else {
    local_1ac = 0;
    local_1b0 = 0;
    local_d8.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_d8 = QList<QString>::begin
                         ((QList<QString> *)
                          CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    local_e0.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_e0 = QList<QString>::end((QList<QString> *)
                                   CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    while( true ) {
      local_e8 = local_e0.i;
      bVar1 = QList<QString>::const_iterator::operator!=(&local_d8,local_e0);
      if (!bVar1) break;
      QList<QString>::const_iterator::operator*(&local_d8);
      QMap<QString,_QList<QString>_>::operator[]
                ((QMap<QString,_QList<QString>_> *)in_stack_fffffffffffffe30,
                 (QString *)in_stack_fffffffffffffe28);
      local_108[0].i = (Command *)0xaaaaaaaaaaaaaaaa;
      in_stack_fffffffffffffe30 = in_RDI;
      local_108[0] = QList<VkSpecParser::Command>::begin
                               ((QList<VkSpecParser::Command> *)
                                CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      local_110.i = (Command *)0xaaaaaaaaaaaaaaaa;
      local_110 = QList<VkSpecParser::Command>::end
                            ((QList<VkSpecParser::Command> *)
                             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      while( true ) {
        local_118 = local_110.i;
        bVar1 = QList<VkSpecParser::Command>::const_iterator::operator!=(local_108,local_110);
        if (!bVar1) break;
        in_stack_fffffffffffffe28 =
             QList<VkSpecParser::Command>::const_iterator::operator*(local_108);
        bVar1 = QListSpecialMethods<QString>::contains
                          (in_stack_fffffffffffffe18,
                           (QString *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                           in_stack_fffffffffffffe0c);
        if (bVar1) {
          if ((in_stack_fffffffffffffe28->deviceLevel & 1U) == 0) {
            local_1b0 = local_1b0 + 1;
          }
          else {
            local_1ac = local_1ac + 1;
          }
        }
        QList<VkSpecParser::Command>::const_iterator::operator++(local_108);
      }
      QList<QString>::~QList((QList<QString> *)0x106971);
      QList<QString>::const_iterator::operator++(&local_d8);
    }
    pcVar3 = genVulkanFunctionsPH::s;
    Preamble::get(in_stack_fffffffffffffe30,(QString *)in_stack_fffffffffffffe28);
    pcVar4 = QByteArray::constData((QByteArray *)0x1069b5);
    QString::asprintf(local_148,pcVar3,pcVar4,(ulong)local_1b0,(ulong)local_1ac);
    QString::toUtf8((QString *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    QIODevice::write((QByteArray *)&local_18);
    QByteArray::~QByteArray((QByteArray *)0x106a0c);
    QString::~QString((QString *)0x106a19);
    QByteArray::~QByteArray((QByteArray *)0x106a26);
    local_179 = true;
  }
  QFile::~QFile((QFile *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_179;
}

Assistant:

bool genVulkanFunctionsPH(const QList<VkSpecParser::Command> &commands,
                          const QMap<QString, QStringList> &versionCommandMapping,
                          const QString &licHeaderFn,
                          const QString &outputBase)
{
    QFile f(outputBase + QStringLiteral("_p.h"));
    if (!f.open(QIODevice::WriteOnly | QIODevice::Text)) {
        qWarning("Failed to write %s", qPrintable(f.fileName()));
        return false;
    }

    static const char *s =
"%s\n"
"#ifndef QVULKANFUNCTIONS_P_H\n"
"#define QVULKANFUNCTIONS_P_H\n"
"\n"
"//\n"
"//  W A R N I N G\n"
"//  -------------\n"
"//\n"
"// This file is not part of the Qt API.  It exists purely as an\n"
"// implementation detail.  This header file may change from version to\n"
"// version without notice, or even be removed.\n"
"//\n"
"// We mean it.\n"
"//\n"
"\n"
"#include \"qvulkanfunctions.h\"\n"
"\n"
"QT_BEGIN_NAMESPACE\n"
"\n"
"class QVulkanInstance;\n"
"\n"
"class QVulkanFunctionsPrivate\n"
"{\n"
"public:\n"
"    QVulkanFunctionsPrivate(QVulkanInstance *inst);\n"
"\n"
"    PFN_vkVoidFunction m_funcs[%d];\n"
"};\n"
"\n"
"class QVulkanDeviceFunctionsPrivate\n"
"{\n"
"public:\n"
"    QVulkanDeviceFunctionsPrivate(QVulkanInstance *inst, VkDevice device);\n"
"\n"
"    PFN_vkVoidFunction m_funcs[%d];\n"
"};\n"
"\n"
"QT_END_NAMESPACE\n"
"\n"
"#endif // QVULKANFUNCTIONS_P_H\n";

    int devLevelCount = 0;
    int instLevelCount = 0;
    for (const QString &version : VERSIONS) {
        const QStringList &coreFunctionsInVersion = versionCommandMapping[version];
        for (const VkSpecParser::Command &c : commands) {
            if (!coreFunctionsInVersion.contains(c.cmd.name))
                continue;

            if (c.deviceLevel)
                devLevelCount += 1;
            else
                instLevelCount += 1;
        }
    }

    f.write(QString::asprintf(s, preamble.get(licHeaderFn).constData(), instLevelCount, devLevelCount).toUtf8());

    return true;
}